

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void musig_test_vectors_tweak(void)

{
  bool bVar1;
  int iVar2;
  secp256k1_musig_keyagg_cache keyagg_cache_1;
  MUSIG_ERROR error_1;
  musig_tweak_case *c_1;
  uchar partial_sig32 [32];
  secp256k1_keypair keypair;
  secp256k1_musig_partial_sig partial_sig;
  secp256k1_musig_session session;
  secp256k1_musig_pubnonce pubnonce;
  secp256k1_musig_keyagg_cache keyagg_cache;
  MUSIG_ERROR error;
  musig_tweak_case *c;
  secp256k1_musig_secnonce secnonce;
  secp256k1_musig_aggnonce aggnonce;
  secp256k1_pubkey pubkey;
  musig_tweak_vector *vector;
  size_t i;
  size_t *sig;
  uchar *out32;
  secp256k1_context *ctx;
  size_t in_stack_fffffffffffffb70;
  uchar *in_stack_fffffffffffffb78;
  secp256k1_pubkey *in_stack_fffffffffffffb80;
  secp256k1_context *in_stack_fffffffffffffb88;
  uchar *in_stack_fffffffffffffb98;
  secp256k1_keypair *in_stack_fffffffffffffba0;
  secp256k1_context *in_stack_fffffffffffffba8;
  secp256k1_pubkey *in_stack_fffffffffffffbb0;
  uchar *in_stack_fffffffffffffbb8;
  secp256k1_musig_secnonce *in_stack_fffffffffffffbc0;
  uchar *in_stack_fffffffffffffbd8;
  secp256k1_musig_aggnonce *in_stack_fffffffffffffbe0;
  secp256k1_context *in_stack_fffffffffffffbe8;
  int local_3f4;
  undefined1 local_3e8 [392];
  size_t in_stack_fffffffffffffda0;
  secp256k1_musig_keyagg_cache *in_stack_fffffffffffffda8;
  uchar (*in_stack_fffffffffffffdb0) [33];
  secp256k1_musig_aggnonce *in_stack_fffffffffffffdb8;
  secp256k1_musig_keyagg_cache *in_stack_fffffffffffffdc0;
  secp256k1_context *in_stack_fffffffffffffdc8;
  size_t *in_stack_fffffffffffffde0;
  size_t in_stack_fffffffffffffde8;
  secp256k1_musig_session *in_stack_fffffffffffffdf0;
  secp256k1_musig_keyagg_cache *in_stack_fffffffffffffdf8;
  secp256k1_keypair *in_stack_fffffffffffffe00;
  secp256k1_musig_secnonce *in_stack_fffffffffffffe08;
  secp256k1_musig_partial_sig *in_stack_fffffffffffffe10;
  secp256k1_context *in_stack_fffffffffffffe18;
  secp256k1_musig_session *in_stack_ffffffffffffff80;
  secp256k1_musig_keyagg_cache *in_stack_ffffffffffffff88;
  secp256k1_pubkey *in_stack_ffffffffffffff90;
  secp256k1_musig_pubnonce *in_stack_ffffffffffffff98;
  secp256k1_musig_partial_sig *in_stack_ffffffffffffffa0;
  secp256k1_context *in_stack_ffffffffffffffa8;
  ulong local_10;
  
  iVar2 = secp256k1_musig_aggnonce_parse
                    (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x3e3,
            "test condition failed: secp256k1_musig_aggnonce_parse(CTX, &aggnonce, vector->aggnonce)"
           );
    abort();
  }
  iVar2 = secp256k1_ec_pubkey_parse
                    (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                     in_stack_fffffffffffffb70);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x3e4,
            "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pubkey, vector->pubkeys[0], sizeof(vector->pubkeys[0]))"
           );
    abort();
  }
  local_10 = 0;
  while( true ) {
    if (4 < local_10) {
      bVar1 = false;
      while( true ) {
        if (bVar1) {
          return;
        }
        iVar2 = musig_vectors_keyagg_and_tweak
                          ((MUSIG_ERROR *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                           in_stack_fffffffffffffdb8->data,in_stack_fffffffffffffdb0,
                           in_stack_fffffffffffffda8->data,in_stack_fffffffffffffda0,
                           in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,
                           (size_t *)in_stack_fffffffffffffdf0,(int *)in_stack_fffffffffffffdf8);
        if (iVar2 != 0) break;
        if (local_3f4 != 1) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
                  ,0x403,"test condition failed: error == MUSIG_TWEAK");
          abort();
        }
        bVar1 = true;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x402,
              "test condition failed: !musig_vectors_keyagg_and_tweak(&error, &keyagg_cache, NULL, vector->pubkeys, vector->tweaks, c->key_indices_len, c->key_indices, c->tweak_indices_len, c->tweak_indices, c->is_xonly)"
             );
      abort();
    }
    musig_test_set_secnonce
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    iVar2 = secp256k1_keypair_create
                      (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98
                      );
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x3f2,"test condition failed: secp256k1_keypair_create(CTX, &keypair, vector->sk)");
      abort();
    }
    sig = musig_tweak_vector.valid_case[local_10].key_indices;
    out32 = (uchar *)musig_tweak_vector.valid_case[local_10].tweak_indices_len;
    ctx = (secp256k1_context *)musig_tweak_vector.valid_case[local_10].tweak_indices;
    iVar2 = musig_vectors_keyagg_and_tweak
                      ((MUSIG_ERROR *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                       in_stack_fffffffffffffdb8->data,in_stack_fffffffffffffdb0,
                       in_stack_fffffffffffffda8->data,in_stack_fffffffffffffda0,
                       in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,
                       (size_t *)in_stack_fffffffffffffdf0,(int *)in_stack_fffffffffffffdf8);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x3f3,
              "test condition failed: musig_vectors_keyagg_and_tweak(&error, &keyagg_cache, NULL, vector->pubkeys, vector->tweaks, c->key_indices_len, c->key_indices, c->tweak_indices_len, c->tweak_indices, c->is_xonly)"
             );
      abort();
    }
    iVar2 = secp256k1_musig_nonce_process
                      (in_stack_fffffffffffffdc8,
                       (secp256k1_musig_session *)in_stack_fffffffffffffdc0,
                       in_stack_fffffffffffffdb8,*in_stack_fffffffffffffdb0,
                       in_stack_fffffffffffffda8);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x3f5,
              "test condition failed: secp256k1_musig_nonce_process(CTX, &session, &aggnonce, vector->msg, &keyagg_cache)"
             );
      abort();
    }
    iVar2 = secp256k1_musig_partial_sign
                      (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08
                       ,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf0);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x3f7,
              "test condition failed: secp256k1_musig_partial_sign(CTX, &partial_sig, &secnonce, &keypair, &keyagg_cache, &session)"
             );
      abort();
    }
    iVar2 = secp256k1_musig_partial_sig_serialize(ctx,out32,(secp256k1_musig_partial_sig *)sig);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x3f8,
              "test condition failed: secp256k1_musig_partial_sig_serialize(CTX, partial_sig32, &partial_sig)"
             );
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_3e8,musig_tweak_vector.valid_case[local_10].expected,0x20);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x3f9,
              "test condition failed: secp256k1_memcmp_var(partial_sig32, c->expected, sizeof(partial_sig32)) == 0"
             );
      abort();
    }
    iVar2 = secp256k1_musig_pubnonce_parse
                      (in_stack_fffffffffffffbe8,
                       (secp256k1_musig_pubnonce *)in_stack_fffffffffffffbe0,
                       in_stack_fffffffffffffbd8);
    if (iVar2 == 0) break;
    iVar2 = secp256k1_musig_partial_sig_verify
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                       ,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff80);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x3fc,
              "test condition failed: secp256k1_musig_partial_sig_verify(CTX, &partial_sig, &pubnonce, &pubkey, &keyagg_cache, &session)"
             );
      abort();
    }
    local_10 = local_10 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
          ,0x3fb,
          "test condition failed: secp256k1_musig_pubnonce_parse(CTX, &pubnonce, vector->pubnonces[c->nonce_indices[c->signer_index]])"
         );
  abort();
}

Assistant:

static void musig_test_vectors_tweak(void) {
    size_t i;
    const struct musig_tweak_vector *vector = &musig_tweak_vector;
    secp256k1_pubkey pubkey;
    secp256k1_musig_aggnonce aggnonce;
    secp256k1_musig_secnonce secnonce;

    CHECK(secp256k1_musig_aggnonce_parse(CTX, &aggnonce, vector->aggnonce));
    CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, vector->pubkeys[0], sizeof(vector->pubkeys[0])));

    for (i = 0; i < sizeof(vector->valid_case)/sizeof(vector->valid_case[0]); i++) {
        const struct musig_tweak_case *c = &vector->valid_case[i];
        enum MUSIG_ERROR error;
        secp256k1_musig_keyagg_cache keyagg_cache;
        secp256k1_musig_pubnonce pubnonce;
        secp256k1_musig_session session;
        secp256k1_musig_partial_sig partial_sig;
        secp256k1_keypair keypair;
        unsigned char partial_sig32[32];

        musig_test_set_secnonce(&secnonce, vector->secnonce, &pubkey);

        CHECK(secp256k1_keypair_create(CTX, &keypair, vector->sk));
        CHECK(musig_vectors_keyagg_and_tweak(&error, &keyagg_cache, NULL, vector->pubkeys, vector->tweaks, c->key_indices_len, c->key_indices, c->tweak_indices_len, c->tweak_indices, c->is_xonly));

        CHECK(secp256k1_musig_nonce_process(CTX, &session, &aggnonce, vector->msg, &keyagg_cache));

        CHECK(secp256k1_musig_partial_sign(CTX, &partial_sig, &secnonce, &keypair, &keyagg_cache, &session));
        CHECK(secp256k1_musig_partial_sig_serialize(CTX, partial_sig32, &partial_sig));
        CHECK(secp256k1_memcmp_var(partial_sig32, c->expected, sizeof(partial_sig32)) == 0);

        CHECK(secp256k1_musig_pubnonce_parse(CTX, &pubnonce, vector->pubnonces[c->nonce_indices[c->signer_index]]));
        CHECK(secp256k1_musig_partial_sig_verify(CTX, &partial_sig, &pubnonce, &pubkey, &keyagg_cache, &session));
    }
    for (i = 0; i < sizeof(vector->error_case)/sizeof(vector->error_case[0]); i++) {
        const struct musig_tweak_case *c = &vector->error_case[i];
        enum MUSIG_ERROR error;
        secp256k1_musig_keyagg_cache keyagg_cache;
        CHECK(!musig_vectors_keyagg_and_tweak(&error, &keyagg_cache, NULL, vector->pubkeys, vector->tweaks, c->key_indices_len, c->key_indices, c->tweak_indices_len, c->tweak_indices, c->is_xonly));
        CHECK(error == MUSIG_TWEAK);
    }
}